

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uchar.cpp
# Opt level: O3

UBool uscript_hasScript_63(UChar32 c,UScriptCode sc)

{
  ushort uVar1;
  UScriptCode UVar2;
  ulong uVar3;
  ushort *puVar4;
  UScriptCode UVar5;
  
  UVar2 = u_getUnicodeProperties_63(c,0);
  UVar5 = UVar2 & 0xc000ff;
  if (0x3fffff < (uint)UVar5) {
    uVar3 = (ulong)(uint)(UVar2 & (USCRIPT_MATHEMATICAL_NOTATION|USCRIPT_TAI_VIET));
    if (0xbfffff < (uint)UVar5) {
      uVar3 = (ulong)scriptExtensions[uVar3 + 1];
    }
    puVar4 = scriptExtensions + uVar3;
    if (USCRIPT_OLD_SOGDIAN < sc) {
      return '\0';
    }
    do {
      uVar1 = *puVar4;
      puVar4 = puVar4 + 1;
    } while ((int)(uint)uVar1 < sc);
    UVar5 = (uint)uVar1 & 0x7fff;
  }
  return UVar5 == sc;
}

Assistant:

U_CAPI UBool U_EXPORT2
uscript_hasScript(UChar32 c, UScriptCode sc) {
    const uint16_t *scx;
    uint32_t scriptX=u_getUnicodeProperties(c, 0)&UPROPS_SCRIPT_X_MASK;
    if(scriptX<UPROPS_SCRIPT_X_WITH_COMMON) {
        return sc==(UScriptCode)scriptX;
    }

    scx=scriptExtensions+(scriptX&UPROPS_SCRIPT_MASK);
    if(scriptX>=UPROPS_SCRIPT_X_WITH_OTHER) {
        scx=scriptExtensions+scx[1];
    }
    if(sc>=USCRIPT_CODE_LIMIT) {
        /* Guard against bogus input that would make us go past the Script_Extensions terminator. */
        return FALSE;
    }
    while(sc>*scx) {
        ++scx;
    }
    return sc==(*scx&0x7fff);
}